

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  long lVar1;
  sqlite3 *db;
  int n;
  RenameCtx *pRVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *z;
  RenameToken *pRVar8;
  RenameCtx *pRVar9;
  char *pcVar10;
  ulong __n;
  RenameToken *p;
  int iVar11;
  char *local_90;
  char *local_68;
  char *local_60;
  byte *__src;
  
  uVar3 = sqlite3Strlen30(zNew);
  uVar4 = sqlite3Strlen30(zSql);
  __n = (ulong)uVar4;
  db = pCtx->pOut->db;
  if (zNew == (char *)0x0) {
    lVar1 = __n * 2 + 1;
    z = (char *)sqlite3DbMallocZero(db,lVar1 * 3);
    iVar5 = 0;
    if (z == (char *)0x0) {
      iVar5 = 7;
      local_90 = (char *)0x0;
      goto LAB_001882fe;
    }
    local_60 = z + lVar1;
    local_68 = z + __n * 4 + 2;
    local_90 = (char *)0x0;
  }
  else {
    local_90 = sqlite3MPrintf(db,"\"%w\" ",zNew);
    if (local_90 == (char *)0x0) {
      return 7;
    }
    iVar5 = sqlite3Strlen30(local_90);
    iVar5 = iVar5 + -1;
    z = (char *)sqlite3DbMallocZero(db,(long)pRename->nList * (long)iVar5 + __n + 1);
    if (z == (char *)0x0) {
      iVar5 = 7;
      goto LAB_001882fe;
    }
    local_68 = (char *)0x0;
    local_60 = (char *)0x0;
  }
  memcpy(z,zSql,__n);
  n = uVar4 * 2;
  while (pRVar8 = pRename->pList, p = pRVar8, pRVar8 != (RenameToken *)0x0) {
    while (pRVar8 = pRVar8->pNext, pRVar2 = pRename, pRVar8 != (RenameToken *)0x0) {
      if ((p->t).z < (pRVar8->t).z) {
        p = pRVar8;
      }
    }
    do {
      pRVar9 = pRVar2;
      pRVar8 = pRVar9->pList;
      pRVar2 = (RenameCtx *)&pRVar8->pNext;
    } while (pRVar8 != p);
    pRVar9->pList = p->pNext;
    __src = (byte *)(p->t).z;
    if (zNew == (char *)0x0) {
      memcpy(local_60,__src,(ulong)(p->t).n);
      local_60[(p->t).n] = '\0';
      sqlite3Dequote(local_60);
      pcVar10 = "\")\n";
      if ((p->t).z[(p->t).n] == '\'') {
        pcVar10 = ",\n  ";
      }
      sqlite3_snprintf(n,local_68,"%Q%s",local_60,pcVar10 + 3);
      uVar6 = sqlite3Strlen30(local_68);
      __src = (byte *)(p->t).z;
      pcVar10 = local_68;
    }
    else if ((bQuote != 0) || (pcVar10 = zNew, uVar6 = uVar3, (""[*__src] & 0x46) == 0)) {
      pcVar10 = local_90;
      uVar6 = (uint)(__src[(p->t).n] == 0x22) + iVar5;
    }
    iVar11 = (int)__src - (int)zSql;
    uVar7 = (p->t).n;
    if (uVar7 != uVar6) {
      uVar7 = uVar7 + iVar11;
      memmove(z + (uVar6 + iVar11),z + uVar7,(ulong)(uVar4 - uVar7));
      uVar4 = uVar4 + (uVar6 - (p->t).n);
      z[(int)uVar4] = '\0';
    }
    memcpy(z + iVar11,pcVar10,(ulong)uVar6);
    sqlite3DbFree(db,p);
  }
  sqlite3_result_text(pCtx,z,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3DbFreeNN(db,z);
  iVar5 = 0;
LAB_001882fe:
  sqlite3_free(local_90);
  return iVar5;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  i64 nNew = sqlite3Strlen30(zNew);
  i64 nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot = 0;
  char *zOut;
  i64 nQuot = 0;
  char *zBuf1 = 0;
  char *zBuf2 = 0;

  if( zNew ){
    /* Set zQuot to point to a buffer containing a quoted copy of the
    ** identifier zNew. If the corresponding identifier in the original
    ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
    ** point to zQuot so that all substitutions are made using the
    ** quoted version of the new column name.  */
    zQuot = sqlite3MPrintf(db, "\"%w\" ", zNew);
    if( zQuot==0 ){
      return SQLITE_NOMEM;
    }else{
      nQuot = sqlite3Strlen30(zQuot)-1;
    }

    assert( nQuot>=nNew );
    zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  }else{
    zOut = (char*)sqlite3DbMallocZero(db, (nSql*2+1) * 3);
    if( zOut ){
      zBuf1 = &zOut[nSql*2+1];
      zBuf2 = &zOut[nSql*4+2];
    }
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name, or with single-quoted versions of themselves.
  ** All that remains is to construct and return the edited SQL string. */
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      u32 nReplace;
      const char *zReplace;
      RenameToken *pBest = renameColumnTokenNext(pRename);

      if( zNew ){
        if( bQuote==0 && sqlite3IsIdChar(*pBest->t.z) ){
          nReplace = nNew;
          zReplace = zNew;
        }else{
          nReplace = nQuot;
          zReplace = zQuot;
          if( pBest->t.z[pBest->t.n]=='"' ) nReplace++;
        }
      }else{
        /* Dequote the double-quoted token. Then requote it again, this time
        ** using single quotes. If the character immediately following the
        ** original token within the input SQL was a single quote ('), then
        ** add another space after the new, single-quoted version of the
        ** token. This is so that (SELECT "string"'alias') maps to
        ** (SELECT 'string' 'alias'), and not (SELECT 'string''alias').  */
        memcpy(zBuf1, pBest->t.z, pBest->t.n);
        zBuf1[pBest->t.n] = 0;
        sqlite3Dequote(zBuf1);
        sqlite3_snprintf(nSql*2, zBuf2, "%Q%s", zBuf1,
            pBest->t.z[pBest->t.n]=='\'' ? " " : ""
        );
        zReplace = zBuf2;
        nReplace = sqlite3Strlen30(zReplace);
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n],
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}